

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall argparse::Argument::nargs(Argument *this,int aNumArgs)

{
  logic_error *this_00;
  int aNumArgs_local;
  Argument *this_local;
  
  if (aNumArgs < 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Number of arguments must be non-negative");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this->mNumArgs = aNumArgs;
  return this;
}

Assistant:

Argument &nargs(int aNumArgs) {
    if (aNumArgs < 0)
      throw std::logic_error("Number of arguments must be non-negative");
    mNumArgs = aNumArgs;
    return *this;
  }